

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathBezierCubicCurveTo
          (ImDrawList *this,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,int num_segments)

{
  float x1;
  float y1;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  ImVec2 *pIVar8;
  ImVec2 IVar9;
  long lVar10;
  ImVec2 *__dest;
  int iVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  lVar10 = (long)(this->_Path).Size;
  if (lVar10 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                  ,0x70f,"T &ImVector<ImVec2>::back() [T = ImVec2]");
  }
  pIVar8 = (this->_Path).Data;
  x1 = pIVar8[lVar10 + -1].x;
  y1 = pIVar8[lVar10 + -1].y;
  if (num_segments == 0) {
    PathBezierCubicCurveToCasteljau
              (&this->_Path,x1,y1,p2->x,p2->y,p3->x,p3->y,p4->x,p4->y,
               this->_Data->CurveTessellationTol,0);
  }
  else if (0 < num_segments) {
    iVar12 = 1;
    do {
      fVar15 = (float)iVar12 * (1.0 / (float)num_segments);
      fVar16 = 1.0 - fVar15;
      fVar18 = fVar16 * fVar16 * 3.0 * fVar15;
      fVar17 = fVar16 * 3.0 * fVar15 * fVar15;
      fVar15 = fVar15 * fVar15 * fVar15;
      fVar1 = p2->x;
      fVar2 = p3->x;
      fVar3 = p4->x;
      fVar4 = p2->y;
      fVar5 = p3->y;
      fVar6 = p4->y;
      iVar13 = (this->_Path).Size;
      iVar7 = (this->_Path).Capacity;
      if (iVar13 == iVar7) {
        if (iVar7 == 0) {
          iVar11 = 8;
        }
        else {
          iVar11 = iVar7 / 2 + iVar7;
        }
        iVar13 = iVar13 + 1;
        if (iVar13 < iVar11) {
          iVar13 = iVar11;
        }
        if (iVar7 < iVar13) {
          __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar13 << 3);
          pIVar8 = (this->_Path).Data;
          if (pIVar8 != (ImVec2 *)0x0) {
            memcpy(__dest,pIVar8,(long)(this->_Path).Size << 3);
            ImGui::MemFree((this->_Path).Data);
          }
          (this->_Path).Data = __dest;
          (this->_Path).Capacity = iVar13;
        }
      }
      fVar16 = fVar16 * fVar16 * fVar16;
      IVar9.y = fVar15 * fVar6 + fVar17 * fVar5 + fVar16 * y1 + fVar18 * fVar4;
      IVar9.x = fVar3 * fVar15 + fVar2 * fVar17 + fVar16 * x1 + fVar1 * fVar18;
      (this->_Path).Data[(this->_Path).Size] = IVar9;
      (this->_Path).Size = (this->_Path).Size + 1;
      bVar14 = iVar12 != num_segments;
      iVar12 = iVar12 + 1;
    } while (bVar14);
  }
  return;
}

Assistant:

void ImDrawList::PathBezierCubicCurveTo(const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        PathBezierCubicCurveToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, _Data->CurveTessellationTol, 0); // Auto-tessellated
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
            _Path.push_back(ImBezierCubicCalc(p1, p2, p3, p4, t_step * i_step));
    }
}